

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TempTracker.cpp
# Opt level: O0

bool __thiscall
NumberTemp::IsTempPropertyTransferStore(NumberTemp *this,Instr *instr,BackwardPass *backwardPass)

{
  OpCode OVar1;
  code *pcVar2;
  bool bVar3;
  BOOLEAN BVar4;
  SymID i;
  int iVar5;
  Opnd *pOVar6;
  undefined4 *puVar7;
  SymOpnd *pSVar8;
  PropertySym *propertySym_00;
  ThreadContextInfo *pTVar9;
  byte local_4b;
  SymID propertySymId;
  PropertySym *propertySym;
  Opnd *dst;
  BackwardPass *backwardPass_local;
  Instr *instr_local;
  NumberTemp *this_local;
  
  bVar3 = DoMarkTempNumbersOnTempObjects(this,backwardPass);
  if (bVar3) {
    OVar1 = instr->m_opcode;
    if (((OVar1 == StFld) || (OVar1 == StFldStrict)) || (OVar1 == InitFld)) {
      pOVar6 = IR::Instr::GetDst(instr);
      bVar3 = IR::Opnd::IsSymOpnd(pOVar6);
      if (!bVar3) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar7 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar7 = 1;
        bVar3 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/TempTracker.cpp"
                           ,0x2d4,"(dst->IsSymOpnd())","dst->IsSymOpnd()");
        if (!bVar3) {
          pcVar2 = (code *)invalidInstructionException();
          (*pcVar2)();
        }
        puVar7 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar7 = 0;
      }
      bVar3 = IR::Opnd::CanStoreTemp(pOVar6);
      if (!bVar3) {
        return false;
      }
      pSVar8 = IR::Opnd::AsSymOpnd(pOVar6);
      propertySym_00 = Sym::AsPropertySym(pSVar8->m_sym);
      i = GetRepresentativePropertySymId(this,propertySym_00,backwardPass);
      BVar4 = BVSparse<Memory::JitArenaAllocator>::Test
                        ((BVSparse<Memory::JitArenaAllocator> *)this,i);
      local_4b = 0;
      if (BVar4 == '\0') {
        pTVar9 = Func::GetThreadContextInfo(instr->m_func);
        iVar5 = (*pTVar9->_vptr_ThreadContextInfo[10])
                          (pTVar9,(ulong)(uint)propertySym_00->m_propertyId);
        local_4b = (byte)iVar5 ^ 0xff;
      }
      return (bool)(local_4b & 1);
    }
    pOVar6 = IR::Instr::GetDst(instr);
    if (pOVar6 != (Opnd *)0x0) {
      pOVar6 = IR::Instr::GetDst(instr);
      bVar3 = IR::Opnd::CanStoreTemp(pOVar6);
      if (bVar3) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar7 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar7 = 1;
        bVar3 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/TempTracker.cpp"
                           ,0x2e5,"(instr->GetDst() == nullptr || !instr->GetDst()->CanStoreTemp())"
                           ,"instr->GetDst() == nullptr || !instr->GetDst()->CanStoreTemp()");
        if (!bVar3) {
          pcVar2 = (code *)invalidInstructionException();
          (*pcVar2)();
        }
        puVar7 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar7 = 0;
      }
    }
  }
  return false;
}

Assistant:

bool
NumberTemp::IsTempPropertyTransferStore(IR::Instr * instr, BackwardPass * backwardPass)
{
    if (DoMarkTempNumbersOnTempObjects(backwardPass))
    {
        switch (instr->m_opcode)
        {
        case Js::OpCode::InitFld:
        case Js::OpCode::StFld:
        case Js::OpCode::StFldStrict:
            {
                IR::Opnd * dst = instr->GetDst();
                Assert(dst->IsSymOpnd());
                if (!dst->CanStoreTemp())
                {
                    return false;
                }
                // We don't mark temp store of numeric properties (e.g. object literal { 86: foo });
                // This should only happen for InitFld, as StFld should have changed to StElem
                PropertySym *propertySym = dst->AsSymOpnd()->m_sym->AsPropertySym();
                SymID propertySymId = this->GetRepresentativePropertySymId(propertySym, backwardPass);
                return !this->nonTempSyms.Test(propertySymId) &&
                    !instr->m_func->GetThreadContextInfo()->IsNumericProperty(propertySym->m_propertyId);
            }
        };

        // All other opcode shouldn't have sym opnd that can store temp, see ObjectTemp::IsTempUseOpCodeSym.
        // We also never mark the dst indir as can store temp for StElemI_A because we don't know what property
        // it is storing in (or it could be an array index).
        Assert(instr->GetDst() == nullptr || !instr->GetDst()->CanStoreTemp());
    }
    return false;
}